

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::FindFileByName
          (SourceTreeDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  ulong uVar1;
  DescriptorDatabase *pDVar2;
  MultiFileErrorCollector *pMVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  SingleFileErrorCollector file_error_collector;
  Parser parser;
  Tokenizer tokenizer;
  SingleFileErrorCollector SStack_1a8;
  Parser local_170;
  Tokenizer local_f0;
  ZeroCopyInputStream *input;
  
  iVar5 = (*this->source_tree_->_vptr_SourceTree[2])();
  input = (ZeroCopyInputStream *)CONCAT44(extraout_var,iVar5);
  if (input == (ZeroCopyInputStream *)0x0) {
    pDVar2 = this->fallback_database_;
    if ((pDVar2 != (DescriptorDatabase *)0x0) &&
       (iVar5 = (*pDVar2->_vptr_DescriptorDatabase[2])(pDVar2,filename,output), (char)iVar5 != '\0')
       ) {
      return true;
    }
    pMVar3 = this->error_collector_;
    if (pMVar3 != (MultiFileErrorCollector *)0x0) {
      (*this->source_tree_->_vptr_SourceTree[3])(&local_f0);
      (*pMVar3->_vptr_MultiFileErrorCollector[2])(pMVar3,filename,0xffffffff,0,&local_f0);
      if ((undefined1 **)local_f0.current_._0_8_ != (undefined1 **)((long)&local_f0 + 0x10U)) {
        operator_delete((void *)local_f0.current_._0_8_);
      }
    }
    bVar4 = false;
  }
  else {
    SingleFileErrorCollector::SingleFileErrorCollector(&SStack_1a8,filename,this->error_collector_);
    io::Tokenizer::Tokenizer(&local_f0,input,&SStack_1a8.super_ErrorCollector);
    Parser::Parser(&local_170);
    if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
      local_170.error_collector_ = &SStack_1a8.super_ErrorCollector;
    }
    if (this->using_validation_error_collector_ == true) {
      local_170.source_location_table_ = &this->source_locations_;
    }
    *(byte *)(output->_has_bits_).has_bits_ = (byte)(output->_has_bits_).has_bits_[0] | 1;
    uVar1 = (output->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
    internal::ArenaStringPtr::Set(&output->name_,filename,puVar6);
    bVar4 = Parser::Parse(&local_170,&local_f0,output);
    bVar4 = (bool)(bVar4 & (SStack_1a8.had_errors_ ^ 1U));
    Parser::~Parser(&local_170);
    io::Tokenizer::~Tokenizer(&local_f0);
    SingleFileErrorCollector::~SingleFileErrorCollector(&SStack_1a8);
    (*input->_vptr_ZeroCopyInputStream[1])(input);
  }
  return bVar4;
}

Assistant:

bool SourceTreeDescriptorDatabase::FindFileByName(const std::string& filename,
                                                  FileDescriptorProto* output) {
  std::unique_ptr<io::ZeroCopyInputStream> input(source_tree_->Open(filename));
  if (input == NULL) {
    if (fallback_database_ != nullptr &&
        fallback_database_->FindFileByName(filename, output)) {
      return true;
    }
    if (error_collector_ != NULL) {
      error_collector_->AddError(filename, -1, 0,
                                 source_tree_->GetLastErrorMessage());
    }
    return false;
  }

  // Set up the tokenizer and parser.
  SingleFileErrorCollector file_error_collector(filename, error_collector_);
  io::Tokenizer tokenizer(input.get(), &file_error_collector);

  Parser parser;
  if (error_collector_ != NULL) {
    parser.RecordErrorsTo(&file_error_collector);
  }
  if (using_validation_error_collector_) {
    parser.RecordSourceLocationsTo(&source_locations_);
  }

  // Parse it.
  output->set_name(filename);
  return parser.Parse(&tokenizer, output) && !file_error_collector.had_errors();
}